

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

double house(double *x,int N,double *v)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double *C;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  double local_38;
  
  C = (double *)malloc(8);
  if (N < 2) {
    *C = 0.0;
  }
  else {
    mmult(x + 1,x + 1,C,1,N + -1,1);
  }
  *v = 1.0;
  for (lVar5 = 1; lVar5 < N; lVar5 = lVar5 + 1) {
    v[lVar5] = x[lVar5];
  }
  dVar1 = *C;
  dVar2 = *x;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
LAB_0011c891:
    dVar2 = dVar2 * dVar2 + dVar1;
    if (dVar2 < 0.0) {
      dVar2 = sqrt(dVar2);
    }
    else {
      dVar2 = SQRT(dVar2);
    }
    dVar3 = *x;
    dVar2 = (double)(-(ulong)(0.0 < dVar3) & (ulong)(-dVar1 / (dVar2 + dVar3)) |
                    ~-(ulong)(0.0 < dVar3) & (ulong)(dVar3 - dVar2));
    *v = dVar2;
    uVar4 = 0;
    uVar6 = (ulong)(uint)N;
    if (N < 1) {
      uVar6 = uVar4;
    }
    for (; uVar6 != uVar4; uVar4 = uVar4 + 1) {
      v[uVar4] = v[uVar4] / dVar2;
    }
    local_38 = ((dVar2 + dVar2) * dVar2) / (dVar2 * dVar2 + dVar1);
  }
  else {
    if (0.0 <= dVar2) {
      uVar7 = 0;
    }
    else {
      if (0.0 <= dVar2) goto LAB_0011c891;
      uVar7 = 0xc0000000;
    }
    local_38 = (double)((ulong)uVar7 << 0x20);
  }
  free(C);
  return local_38;
}

Assistant:

double house(double*x,int N,double *v) {
	double beta;
	beta = house_1(x,N,v);
	return beta;
}